

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void write_dec_ref_base_pic_marking(nal_t *nal,bs_t *b)

{
  _Bool _Var1;
  byte *pbVar2;
  int iVar3;
  
  _Var1 = nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag;
  iVar3 = b->bits_left + -1;
  b->bits_left = iVar3;
  pbVar2 = b->p;
  if (pbVar2 < b->end) {
    *pbVar2 = *pbVar2 & ~(byte)(1 << ((byte)iVar3 & 0x1f));
    *b->p = *b->p | _Var1 << ((byte)b->bits_left & 0x1f);
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  if (nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag == true) {
    do {
      bs_write_ue(b,nal->prefix_nal_svc->memory_management_base_control_operation);
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 1) {
        bs_write_ue(b,nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
      }
      if (nal->prefix_nal_svc->memory_management_base_control_operation == 2) {
        bs_write_ue(b,nal->prefix_nal_svc->long_term_base_pic_num);
      }
    } while (nal->prefix_nal_svc->memory_management_base_control_operation != 0);
  }
  return;
}

Assistant:

void write_dec_ref_base_pic_marking(nal_t* nal, bs_t* b)
{
    bs_write_u1(b, nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag);
    if( nal->prefix_nal_svc->adaptive_ref_base_pic_marking_mode_flag )
    {
        do {
            bs_write_ue(b, nal->prefix_nal_svc->memory_management_base_control_operation);
            
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 1 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->difference_of_base_pic_nums_minus1);
            }
            if( nal->prefix_nal_svc->memory_management_base_control_operation == 2 )
            {
                bs_write_ue(b, nal->prefix_nal_svc->long_term_base_pic_num);
            }
        } while( nal->prefix_nal_svc->memory_management_base_control_operation != 0 );
    }
}